

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O3

void canvas_loadbangsubpatches(_glist *x)

{
  t_gobj *x_00;
  t_symbol *s;
  _class *p_Var1;
  t_gotfn p_Var2;
  _glist *x_01;
  
  s = gensym("loadbang");
  x_01 = (_glist *)x->gl_list;
  p_Var1 = canvas_class;
  if (x_01 != (_glist *)0x0) {
    do {
      if (((x_01->gl_obj).te_g.g_pd == p_Var1) && (x_01->gl_env == (_canvasenvironment *)0x0)) {
        canvas_loadbangsubpatches(x_01);
        p_Var1 = canvas_class;
      }
      x_01 = (_glist *)(x_01->gl_obj).te_g.g_next;
    } while (x_01 != (_glist *)0x0);
    for (x_00 = x->gl_list; x_00 != (t_gobj *)0x0; x_00 = x_00->g_next) {
      if (((x_00->g_pd != canvas_class) && (x_00->g_pd != clone_class)) &&
         (p_Var2 = zgetfn(&x_00->g_pd,s), p_Var2 != (t_gotfn)0x0)) {
        pd_vmess(&x_00->g_pd,s,"f",0);
      }
    }
  }
  return;
}

Assistant:

void canvas_loadbangsubpatches(t_canvas *x)
{
    t_gobj *y;
    t_symbol *s = gensym("loadbang");
    for (y = x->gl_list; y; y = y->g_next)
        if (pd_class(&y->g_pd) == canvas_class)
        {
            if (!canvas_isabstraction((t_canvas *)y))
                canvas_loadbangsubpatches((t_canvas *)y);
        }
    for (y = x->gl_list; y; y = y->g_next)
        if ((pd_class(&y->g_pd) != canvas_class) &&
            (pd_class(&y->g_pd) != clone_class) &&
            zgetfn(&y->g_pd, s))
        {
            pd_vmess(&y->g_pd, s, "f", (t_floatarg)LB_LOAD);
        }
}